

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

int testing_is_uniprocessor(testing t)

{
  uint uVar1;
  closure *pcVar2;
  bool bVar3;
  nsync_time nVar4;
  nsync_time delay;
  nsync_time delay_00;
  nsync_time delay_01;
  nsync *local_3c0;
  nsync *local_3a0;
  nsync *local_380;
  nsync *local_360;
  atomic<unsigned_int> local_34c;
  undefined1 auStack_348 [4];
  nsync_atomic_uint32_ state;
  is_uniprocessor_s s [3];
  int i;
  int is_uniprocessor;
  testing t_local;
  
  nsync::nsync_mu_lock(&t->base->testing_mu);
  s[2]._268_4_ = t->base->is_uniprocessor;
  if (s[2]._268_4_ == -1) {
    s[2].dummy[0xfc] = '\0';
    s[2].dummy[0xfd] = '\0';
    s[2].dummy[0xfe] = '\0';
    s[2].dummy[0xff] = '\0';
    s[2]._268_4_ = 0xffffffff;
    for (; s[2].dummy._252_4_ != 3; s[2].dummy._252_4_ = s[2].dummy._252_4_ + 1) {
      *(undefined8 *)(s[(long)(int)s[2].dummy._252_4_ + -1].dummy + 0xfc) = 0;
      std::__atomic_base<unsigned_int>::operator=
                ((__atomic_base<unsigned_int> *)(s + (int)s[2].dummy._252_4_),0);
    }
    std::atomic_store_explicit<unsigned_int>(&local_34c,0,memory_order_release);
    pcVar2 = closure_uniprocessor_check
                       (uniprocessor_check,&local_34c,(closure_t_uniprocessor_check_1)auStack_348);
    closure_fork(pcVar2);
    nVar4 = nsync::nsync_time_ms(100);
    local_360 = (nsync *)nVar4.tv_sec;
    nVar4.tv_sec = nVar4.tv_nsec;
    nsync::nsync_time_sleep(local_360,nVar4);
    std::atomic_store_explicit<unsigned_int>(&local_34c,1,memory_order_release);
    nVar4 = nsync::nsync_time_ms(400);
    delay.tv_nsec = nVar4.tv_nsec;
    local_380 = (nsync *)nVar4.tv_sec;
    delay.tv_sec = delay.tv_nsec;
    nsync::nsync_time_sleep(local_380,delay);
    std::atomic_store_explicit<unsigned_int>(&local_34c,2,memory_order_release);
    do {
      uVar1 = std::atomic_load_explicit<unsigned_int>
                        ((atomic<unsigned_int> *)s,memory_order_acquire);
    } while (uVar1 == 0);
    std::atomic_store_explicit<unsigned_int>(&local_34c,0,memory_order_release);
    pcVar2 = closure_uniprocessor_check
                       (uniprocessor_check,&local_34c,
                        (closure_t_uniprocessor_check_1)(s[0].dummy + 0xfc));
    closure_fork(pcVar2);
    pcVar2 = closure_uniprocessor_check
                       (uniprocessor_check,&local_34c,
                        (closure_t_uniprocessor_check_1)(s[1].dummy + 0xfc));
    closure_fork(pcVar2);
    nVar4 = nsync::nsync_time_ms(100);
    delay_00.tv_nsec = nVar4.tv_nsec;
    local_3a0 = (nsync *)nVar4.tv_sec;
    delay_00.tv_sec = delay_00.tv_nsec;
    nsync::nsync_time_sleep(local_3a0,delay_00);
    std::atomic_store_explicit<unsigned_int>(&local_34c,1,memory_order_release);
    nVar4 = nsync::nsync_time_ms(400);
    delay_01.tv_nsec = nVar4.tv_nsec;
    local_3c0 = (nsync *)nVar4.tv_sec;
    delay_01.tv_sec = delay_01.tv_nsec;
    nsync::nsync_time_sleep(local_3c0,delay_01);
    std::atomic_store_explicit<unsigned_int>(&local_34c,2,memory_order_release);
    do {
      uVar1 = std::atomic_load_explicit<unsigned_int>
                        ((atomic<unsigned_int> *)(s + 1),memory_order_acquire);
      bVar3 = true;
      if (uVar1 != 0) {
        uVar1 = std::atomic_load_explicit<unsigned_int>
                          ((atomic<unsigned_int> *)(s + 2),memory_order_acquire);
        bVar3 = uVar1 == 0;
      }
    } while (bVar3);
    t->base->is_uniprocessor =
         (uint)(((double)s[0]._264_8_ + (double)s[1]._264_8_) / _auStack_348 < 1.7);
    s[2]._268_4_ = t->base->is_uniprocessor;
  }
  nsync::nsync_mu_unlock(&t->base->testing_mu);
  return s[2]._268_4_;
}

Assistant:

int testing_is_uniprocessor (testing t) {
	int is_uniprocessor;
	nsync_mu_lock (&t->base->testing_mu);
	is_uniprocessor = t->base->is_uniprocessor;
	if (is_uniprocessor == -1) {
		int i;
		struct is_uniprocessor_s s[3];
		nsync_atomic_uint32_ state;
		for (i = 0; i != 3; i++) {
			s[i].count = 0.0;
			s[i].done = 0;
		}

		ATM_STORE_REL (&state, 0);
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[0]));
		nsync_time_sleep (nsync_time_ms (100));
		ATM_STORE_REL (&state, 1);
		nsync_time_sleep (nsync_time_ms (400));
		ATM_STORE_REL (&state, 2);
		while (!ATM_LOAD_ACQ (&s[0].done)) {
		}

		ATM_STORE_REL (&state, 0);
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[1]));
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[2]));
		nsync_time_sleep (nsync_time_ms (100));
		ATM_STORE_REL (&state, 1);
		nsync_time_sleep (nsync_time_ms (400));
		ATM_STORE_REL (&state, 2);
		while (!ATM_LOAD_ACQ (&s[1].done) || !ATM_LOAD_ACQ (&s[2].done)) {
		}
                t->base->is_uniprocessor = ((s[1].count + s[2].count) / s[0].count) < 1.7;
		is_uniprocessor = t->base->is_uniprocessor;
	}
	nsync_mu_unlock (&t->base->testing_mu);
	return (is_uniprocessor);
}